

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

bool cmcmd::SymlinkInternal(string *file,string *link)

{
  bool bVar1;
  string linktext;
  string local_38;
  
  bVar1 = cmsys::SystemTools::FileExists(link);
  if (!bVar1) {
    bVar1 = cmsys::SystemTools::FileIsSymlink(link);
    if (!bVar1) goto LAB_0014eebd;
  }
  cmsys::SystemTools::RemoveFile(link);
LAB_0014eebd:
  cmsys::SystemTools::GetFilenameName(&local_38,file);
  bVar1 = cmSystemTools::CreateSymlink(&local_38,link,(string *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmcmd::SymlinkInternal(std::string const& file, std::string const& link)
{
  if (cmSystemTools::FileExists(link) || cmSystemTools::FileIsSymlink(link)) {
    cmSystemTools::RemoveFile(link);
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  return cmSystemTools::CopyFileAlways(file, link);
#else
  std::string linktext = cmSystemTools::GetFilenameName(file);
  return cmSystemTools::CreateSymlink(linktext, link);
#endif
}